

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

string * __thiscall
kratos::get_var_size_str_abi_cxx11_(string *__return_storage_ptr__,kratos *this,Var *var)

{
  ulong uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  size_type sVar3;
  reference pvVar4;
  undefined4 extraout_EDX;
  uint32_t width;
  undefined4 extraout_var;
  string local_78;
  string local_58;
  SystemVerilogCodeGen *local_38;
  Var *p;
  uint local_20;
  undefined1 local_19;
  uint32_t i;
  Var *var_local;
  string *str;
  
  local_19 = 0;
  _i = (Var *)this;
  var_local = (Var *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = 0;
  while( true ) {
    uVar1 = (ulong)local_20;
    pvVar2 = Var::size(_i);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar2);
    if (sVar3 <= uVar1) break;
    local_38 = (SystemVerilogCodeGen *)Var::get_size_param(_i,local_20);
    if (local_38 == (SystemVerilogCodeGen *)0x0) {
      pvVar2 = Var::size(_i);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar2,(ulong)local_20);
      SystemVerilogCodeGen::get_width_str_abi_cxx11_
                (&local_78,(SystemVerilogCodeGen *)(ulong)*pvVar4,width);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      SystemVerilogCodeGen::get_width_str_abi_cxx11_
                (&local_58,local_38,(Var *)CONCAT44(extraout_var,extraout_EDX));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_58);
    }
    local_20 = local_20 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_var_size_str(Var* var) {
    std::string str;
    for (uint32_t i = 0; i < var->size().size(); i++) {
        auto* p = var->get_size_param(i);
        if (p)
            str.append(SystemVerilogCodeGen::get_width_str(p));
        else
            str.append(SystemVerilogCodeGen::get_width_str(var->size()[i]));
    }
    return str;
}